

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalNinjaGenerator::OpenRulesFileStream(cmGlobalNinjaGenerator *this)

{
  char *__s;
  bool bVar1;
  type pcVar2;
  ostream *poVar3;
  allocator<char> local_39;
  string local_38;
  cmGlobalNinjaGenerator *local_18;
  cmGlobalNinjaGenerator *this_local;
  
  __s = NINJA_RULES_FILE;
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  bVar1 = OpenFileStream(this,&this->RulesFileStream,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  bVar1 = ((bVar1 ^ 0xffU) & 1) == 0;
  if (bVar1) {
    pcVar2 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->RulesFileStream);
    poVar3 = std::operator<<((ostream *)pcVar2,
                             "# This file contains all the rules used to get the outputs files\n");
    poVar3 = std::operator<<(poVar3,"# built from the input files.\n");
    poVar3 = std::operator<<(poVar3,"# It is included in the main \'");
    poVar3 = std::operator<<(poVar3,NINJA_BUILD_FILE);
    std::operator<<(poVar3,"\'.\n\n");
  }
  return bVar1;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenRulesFileStream()
{
  if (!this->OpenFileStream(this->RulesFileStream,
                            cmGlobalNinjaGenerator::NINJA_RULES_FILE)) {
    return false;
  }

  // Write comment about this file.
  /* clang-format off */
  *this->RulesFileStream
    << "# This file contains all the rules used to get the outputs files\n"
    << "# built from the input files.\n"
    << "# It is included in the main '" << NINJA_BUILD_FILE << "'.\n\n"
    ;
  /* clang-format on */
  return true;
}